

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::IncompleteTextureAccess::SamplerTest::Check(SamplerTest *this,Configuration configuration)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float local_28 [4];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_28[0] = 7.0;
  local_28[1] = 7.0;
  local_28[2] = 7.0;
  local_28[3] = 7.0;
  bVar4 = false;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))(0,0,1,1,0x1908,0x1406,local_28);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                  ,0x19c);
  local_28[0] = configuration.expected_result[0] - local_28[0];
  fVar6 = -local_28[0];
  if (-local_28[0] <= local_28[0]) {
    fVar6 = local_28[0];
  }
  if (fVar6 <= 0.0125) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 3) break;
      fVar5 = configuration.expected_result[uVar3 + 1] - local_28[uVar3 + 1];
      fVar6 = -fVar5;
      if (-fVar5 <= fVar5) {
        fVar6 = fVar5;
      }
      uVar1 = uVar3 + 1;
    } while (fVar6 <= 0.0125);
    bVar4 = 2 < uVar3;
  }
  return bVar4;
}

Assistant:

bool SamplerTest::Check(Configuration configuration)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return storage. */
	glw::GLfloat result[4] = { 7.f, 7.f, 7.f, 7.f };

	/* Fetch. */
	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < 4 /* # components */; ++i)
	{
		if (de::abs(configuration.expected_result[i] - result[i]) > 0.0125 /* precision */)
		{
			/* Fail.*/
			return false;
		}
	}

	/* Comparsion passed.*/
	return true;
}